

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

units * __thiscall
units::to_string_abi_cxx11_(units *this,measurement *measure,uint64_t match_flags)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  double dVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  undefined8 local_1e8;
  unit local_1e0;
  units local_1d8 [8];
  string str;
  long local_1a8;
  stringstream ss;
  ostream local_198 [376];
  uint64_t local_20;
  uint64_t match_flags_local;
  measurement *measure_local;
  
  local_20 = match_flags;
  match_flags_local = (uint64_t)measure;
  measure_local = (measurement *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  CLI::std::ios_base::precision((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),6);
  dVar4 = measurement::value((measurement *)match_flags_local);
  std::ostream::operator<<(local_198,dVar4);
  local_1e0 = measurement::units((measurement *)match_flags_local);
  to_string_abi_cxx11_(local_1d8,&local_1e0,local_20);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<(local_198,' ');
    pcVar3 = (char *)std::__cxx11::string::front();
    bVar1 = isNumericalStartCharacter(*pcVar3);
    if (bVar1) {
      local_1f0._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1e8,&local_1f0);
      std::__cxx11::string::insert(local_1d8,local_1e8,0x28);
      std::__cxx11::string::push_back((char)local_1d8);
    }
    std::operator<<(local_198,(string *)local_1d8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  return this;
}

Assistant:

std::string to_string(const measurement& measure, std::uint64_t match_flags)
{
    std::stringstream ss;
    ss.precision(6);
    ss << measure.value();

    auto str = to_string(measure.units(), match_flags);
    if (!str.empty()) {
        ss << ' ';
        if (isNumericalStartCharacter(str.front())) {
            str.insert(str.begin(), '(');
            str.push_back(')');
        }
        ss << str;
    }
    return ss.str();
}